

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

void wabt::anon_unknown_21::SPrintLimits(char *dst,size_t size,Limits *limits)

{
  int local_24;
  int result;
  Limits *limits_local;
  size_t size_local;
  char *dst_local;
  
  if ((limits->has_max & 1U) == 0) {
    local_24 = snprintf(dst,size,"initial: %lu",limits->initial);
  }
  else {
    local_24 = snprintf(dst,size,"initial: %lu, max: %lu",limits->initial,limits->max);
  }
  if ((ulong)(long)local_24 < size) {
    return;
  }
  __assert_fail("static_cast<size_t>(result) < size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-reader-logging.cc"
                ,0x2e,
                "void wabt::(anonymous namespace)::SPrintLimits(char *, size_t, const Limits *)");
}

Assistant:

void SPrintLimits(char* dst, size_t size, const Limits* limits) {
  int result;
  if (limits->has_max) {
    result = wabt_snprintf(dst, size, "initial: %" PRIu64 ", max: %" PRIu64,
                           limits->initial, limits->max);
  } else {
    result = wabt_snprintf(dst, size, "initial: %" PRIu64, limits->initial);
  }
  WABT_USE(result);
  assert(static_cast<size_t>(result) < size);
}